

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<std::pair<QObject*,QByteArray>,QPropertyAnimation*>::emplace_helper<QPropertyAnimation*const&>
          (QHash<std::pair<QObject*,QByteArray>,QPropertyAnimation*> *this,
          pair<QObject_*,_QByteArray> *key,QPropertyAnimation **args)

{
  byte bVar1;
  Entry *pEVar2;
  Data *pDVar3;
  char *pcVar4;
  qsizetype qVar5;
  piter pVar6;
  QPropertyAnimation *pQVar7;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<std::pair<QObject*,QByteArray>,QPropertyAnimation*>>::
  findOrInsert<std::pair<QObject*,QByteArray>>
            ((InsertionResult *)local_38,
             *(Data<QHashPrivate::Node<std::pair<QObject*,QByteArray>,QPropertyAnimation*>> **)this,
             key);
  pEVar2 = (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries;
  bVar1 = (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
          [(uint)local_38._8_8_ & 0x7f];
  if (local_38[0x10] == false) {
    *(QObject **)pEVar2[bVar1].storage.data = key->first;
    pDVar3 = (key->second).d.d;
    (key->second).d.d = (Data *)0x0;
    *(Data **)(pEVar2[bVar1].storage.data + 8) = pDVar3;
    pcVar4 = (key->second).d.ptr;
    (key->second).d.ptr = (char *)0x0;
    *(char **)(pEVar2[bVar1].storage.data + 0x10) = pcVar4;
    qVar5 = (key->second).d.size;
    (key->second).d.size = 0;
    *(qsizetype *)(pEVar2[bVar1].storage.data + 0x18) = qVar5;
    pQVar7 = *args;
  }
  else {
    pQVar7 = *args;
  }
  *(QPropertyAnimation **)(pEVar2[bVar1].storage.data + 0x20) = pQVar7;
  pVar6.bucket = local_38._8_8_;
  pVar6.d = (Data<QHashPrivate::Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>_> *)
            local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar6;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }